

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walkExpr(Walker *pWalker,Expr *pExpr)

{
  Select *p;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Expr *pEVar6;
  ExprList **ppEVar7;
  
  do {
    pEVar6 = pExpr;
    uVar2 = (*pWalker->xExprCallback)(pWalker,pEVar6);
    if (uVar2 != 0) {
      return uVar2 & 2;
    }
    if ((pEVar6->flags & 0x810000) != 0) {
      return 0;
    }
    if ((pEVar6->pLeft != (Expr *)0x0) && (iVar3 = walkExpr(pWalker,pEVar6->pLeft), iVar3 != 0)) {
      return 2;
    }
    pExpr = pEVar6->pRight;
  } while (pEVar6->pRight != (Expr *)0x0);
  p = (Select *)(pEVar6->x).pList;
  if ((pEVar6->flags & 0x1000) == 0) {
    if (p != (Select *)0x0) {
      iVar3 = *(int *)p;
      bVar1 = iVar3 < 1;
      if (0 < iVar3) {
        ppEVar7 = (ExprList **)&p->iLimit;
        iVar3 = iVar3 + 1;
        do {
          if (((Expr *)*ppEVar7 != (Expr *)0x0) &&
             (iVar4 = walkExpr(pWalker,(Expr *)*ppEVar7), iVar4 != 0)) {
            if (!bVar1) {
              return 2;
            }
            break;
          }
          ppEVar7 = ppEVar7 + 3;
          iVar5 = iVar3 + -1;
          iVar4 = iVar3 + -3;
          bVar1 = iVar5 < 2;
          iVar3 = iVar5;
        } while (SBORROW4(iVar5,2) == iVar4 < 0);
      }
    }
    if ((pEVar6->flags & 0x1000000) == 0) {
      return 0;
    }
    iVar3 = walkWindowList(pWalker,(pEVar6->y).pWin,1);
  }
  else {
    iVar3 = sqlite3WalkSelect(pWalker,p);
  }
  if (iVar3 == 0) {
    return 0;
  }
  return 2;
}

Assistant:

static SQLITE_NOINLINE int walkExpr(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pLeft && walkExpr(pWalker, pExpr->pLeft) ) return WRC_Abort;
      if( pExpr->pRight ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprUseXSelect(pExpr) ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else{
        if( pExpr->x.pList ){
          if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
        }
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pExpr, EP_WinFunc) ){
          if( walkWindowList(pWalker, pExpr->y.pWin, 1) ) return WRC_Abort;
        }
#endif
      }
    }
    break;
  }
  return WRC_Continue;
}